

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StartThreadNMEADevicex(NMEADEVICE *pNMEADevice)

{
  int iVar1;
  int local_1c;
  int id;
  NMEADEVICE *pNMEADevice_local;
  
  local_1c = 0;
  do {
    if ((NMEADEVICE *)addrsNMEADevice[local_1c] == pNMEADevice) {
      resNMEADevice[local_1c] = 1;
      bExitNMEADevice[local_1c] = 0;
      InitCriticalSection(NMEADeviceCS + local_1c);
      iVar1 = CreateDefaultThread(NMEADeviceThread,pNMEADevice,NMEADeviceThreadId + local_1c);
      return iVar1;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StartThreadNMEADevicex(NMEADEVICE* pNMEADevice)
{
	int id = 0;

	while (addrsNMEADevice[id] != pNMEADevice)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	resNMEADevice[id] = EXIT_FAILURE;
	bExitNMEADevice[id] = FALSE;
	InitCriticalSection(&NMEADeviceCS[id]);
	return CreateDefaultThread(NMEADeviceThread, (void*)pNMEADevice, &NMEADeviceThreadId[id]);
}